

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# silent_printf.cpp
# Opt level: O1

int Silent_PAL_vfprintf(PAL_FILE *stream,char *format,__va_list_tag *aparg)

{
  LPCWSTR pWVar1;
  LPCWSTR lpWideCharStr;
  uint uVar2;
  char *pvBuffer;
  byte bVar3;
  BOOL BVar4;
  int iVar5;
  INT IVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  uint *puVar10;
  undefined8 *puVar11;
  short *psVar12;
  LPSTR lpMultiByteStr;
  LPSTR pCVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  long in_FS_OFFSET;
  undefined1 auStack_498 [8];
  va_list apcopy;
  uint local_474;
  int local_470;
  INT Prefix;
  INT Type;
  INT Flags;
  LPCSTR Fmt;
  INT Width;
  INT Precision;
  va_list ap;
  CHAR local_438 [8];
  CHAR TempBuff [1024];
  
  TempBuff._1016_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  ap[0].overflow_arg_area = aparg->reg_save_area;
  Width = aparg->gp_offset;
  Precision = aparg->fp_offset;
  ap[0]._0_8_ = aparg->overflow_arg_area;
  iVar15 = 0;
  _Type = format;
LAB_0031bc6a:
  do {
    while( true ) {
      if (*_Type == '%') break;
      iVar8 = iVar15;
      if (*_Type == '\0') goto LAB_0031c216;
LAB_0031be04:
      pvBuffer = _Type;
      _Type = _Type + 1;
      PAL_fwrite(pvBuffer,1,1,stream);
      if (*(int *)&((FILE *)stream)->_IO_read_ptr == 1) goto LAB_0031c242;
      iVar15 = iVar15 + 1;
    }
    BVar4 = Silent_ExtractFormatA
                      ((LPCSTR *)&Type,local_438,&Prefix,(LPINT)&Fmt,(LPINT)((long)&Fmt + 4),
                       (LPINT)&local_474,&local_470);
    iVar8 = local_470;
    uVar2 = local_474;
    if (BVar4 == 0) goto LAB_0031be04;
    if (local_470 != 2 || (local_474 ^ 2) != 0) {
      if ((local_474 ^ 2) == 0 && local_470 == 1) {
        if ((int)Fmt + 3U < 2) {
          if ((uint)Width < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        if ((Fmt._4_4_ & 0xfffffffd) == 0xfffffffc) {
          if ((uint)Width < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
          }
          else {
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
        }
        uVar14 = _Width & 0xffffffff;
        if (uVar14 < 0x29) {
          _Width = CONCAT44(Precision,Width + 8);
          puVar10 = (uint *)(uVar14 + (long)ap[0].overflow_arg_area);
        }
        else {
          puVar10 = (uint *)ap[0]._0_8_;
          ap[0]._0_8_ = ap[0]._0_8_ + 8;
        }
        bVar3 = (byte)*puVar10;
        if ((*puVar10 & 0xff00) != 0) {
          bVar3 = 0x3f;
        }
        auStack_498[1] = 0;
        auStack_498[0] = bVar3;
        IVar6 = Silent_AddPaddingVfprintf(stream,auStack_498,(int)Fmt + -1,Prefix);
        if (IVar6 == -1) goto LAB_0031c242;
        iVar15 = iVar15 + IVar6;
      }
      else if (local_470 == 6) {
        if ((int)Fmt == -2) {
          uVar14 = _Width & 0xffffffff;
          if (uVar14 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            piVar9 = (int *)(uVar14 + (long)ap[0].overflow_arg_area);
          }
          else {
            piVar9 = (int *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Fmt._0_4_ = *piVar9;
        }
        if (Fmt._4_4_ == 0xfffffffe) {
          uVar14 = _Width & 0xffffffff;
          if (uVar14 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            puVar10 = (uint *)(uVar14 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar10 = (uint *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          Fmt._4_4_ = *puVar10;
        }
        if (local_474 == 1) {
          uVar14 = _Width & 0xffffffff;
          if (uVar14 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            puVar11 = (undefined8 *)(uVar14 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar11 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(short *)*puVar11 = (short)iVar15;
        }
        else {
          uVar14 = _Width & 0xffffffff;
          if (uVar14 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            puVar11 = (undefined8 *)(uVar14 + (long)ap[0].overflow_arg_area);
          }
          else {
            puVar11 = (undefined8 *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          *(int *)*puVar11 = iVar15;
        }
      }
      else {
        if ((local_470 == 5 && (local_474 ^ 1) == 0) || ((local_474 ^ 1) == 0 && local_470 == 4)) {
          uVar14 = _Width & 0xffffffff;
          if (uVar14 < 0x29) {
            _Width = CONCAT44(Precision,Width + 8);
            psVar12 = (short *)(uVar14 + (long)ap[0].overflow_arg_area);
          }
          else {
            psVar12 = (short *)ap[0]._0_8_;
            ap[0]._0_8_ = ap[0]._0_8_ + 8;
          }
          iVar5 = fprintf((FILE *)stream,local_438,(ulong)(uint)(int)*psVar12);
        }
        else {
          apcopy[0].overflow_arg_area = ap[0].overflow_arg_area;
          auStack_498 = (undefined1  [8])_Width;
          apcopy[0].gp_offset = ap[0].gp_offset;
          apcopy[0].fp_offset = ap[0].fp_offset;
          iVar5 = PAL_vfprintf(stream,local_438,(__va_list_tag *)auStack_498);
          PAL_printf_arg_remover((va_list *)&Width,(int)Fmt,Fmt._4_4_,iVar8,uVar2);
        }
        if (iVar5 == -1) {
          iVar5 = 0;
        }
        iVar15 = iVar15 + iVar5;
      }
      goto LAB_0031bc6a;
    }
    if ((int)Fmt == -3) {
      if ((uint)Width < 0x29) {
        _Width = CONCAT44(Precision,Width + 8);
      }
      else {
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
    }
    else if ((int)Fmt == -2) {
      uVar14 = _Width & 0xffffffff;
      if (uVar14 < 0x29) {
        _Width = CONCAT44(Precision,Width + 8);
        piVar9 = (int *)(uVar14 + (long)ap[0].overflow_arg_area);
      }
      else {
        piVar9 = (int *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      Fmt._0_4_ = *piVar9;
    }
    if (Fmt._4_4_ == 0xfffffffc) {
      if ((uint)Width < 0x29) {
        _Width = CONCAT44(Precision,Width + 8);
      }
      else {
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
    }
    else if (Fmt._4_4_ == 0xfffffffe) {
      uVar14 = _Width & 0xffffffff;
      if (uVar14 < 0x29) {
        _Width = CONCAT44(Precision,Width + 8);
        puVar10 = (uint *)(uVar14 + (long)ap[0].overflow_arg_area);
      }
      else {
        puVar10 = (uint *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      Fmt._4_4_ = *puVar10;
    }
    uVar14 = _Width & 0xffffffff;
    if (uVar14 < 0x29) {
      _Width = CONCAT44(Precision,Width + 8);
      puVar11 = (undefined8 *)(uVar14 + (long)ap[0].overflow_arg_area);
    }
    else {
      puVar11 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    lpWideCharStr = (LPCWSTR)*puVar11;
    if (lpWideCharStr == (LPCWSTR)0x0) {
      lVar16 = 0;
    }
    else if (*lpWideCharStr == L'\0') {
      lVar16 = 1;
    }
    else {
      lVar16 = 1;
      do {
        pWVar1 = lpWideCharStr + lVar16;
        lVar16 = lVar16 + 1;
      } while (*pWVar1 != L'\0');
    }
    iVar5 = (int)lVar16;
    iVar8 = -1;
    apcopy[0].reg_save_area = stream;
    if ((iVar5 == 0) ||
       (lpMultiByteStr = (LPSTR)PAL_malloc((long)iVar5), uVar2 = Fmt._4_4_,
       lpMultiByteStr == (LPSTR)0x0)) goto LAB_0031c216;
    pCVar13 = lpMultiByteStr;
    uVar7 = 0;
    if (Fmt._4_4_ == 0xfffffffd) {
LAB_0031c1ae:
      *pCVar13 = '\0';
    }
    else {
      uVar7 = iVar5 - 1;
      if ((0 < (int)Fmt._4_4_) && ((int)Fmt._4_4_ < (int)uVar7)) {
        iVar8 = Silent_WideCharToMultiByte(lpWideCharStr,Fmt._4_4_,lpMultiByteStr,iVar5);
        if (iVar8 != 0) {
          pCVar13 = lpMultiByteStr + iVar8;
          uVar7 = uVar2;
          goto LAB_0031c1ae;
        }
LAB_0031c23a:
        PAL_free(lpMultiByteStr);
LAB_0031c242:
        iVar8 = -1;
LAB_0031c216:
        if (*(long *)(in_FS_OFFSET + 0x28) == TempBuff._1016_8_) {
          return iVar8;
        }
        __stack_chk_fail();
      }
      iVar8 = Silent_WideCharToMultiByte(lpWideCharStr,-1,lpMultiByteStr,iVar5);
      if (iVar8 == 0) goto LAB_0031c23a;
    }
    stream = (PAL_FILE *)apcopy[0].reg_save_area;
    IVar6 = Silent_AddPaddingVfprintf
                      ((PAL_FILE *)apcopy[0].reg_save_area,lpMultiByteStr,(int)Fmt - uVar7,Prefix);
    if (IVar6 == -1) goto LAB_0031c23a;
    iVar15 = iVar15 + IVar6;
    PAL_free(lpMultiByteStr);
  } while( true );
}

Assistant:

int Silent_PAL_vfprintf(PAL_FILE *stream, const char *format, va_list aparg)
{
    CHAR TempBuff[1024]; /* used to hold a single %<foo> format string */
    LPCSTR Fmt = format;
    LPWSTR TempWStr;
    LPSTR TempStr;
    WCHAR TempWChar;
    INT Flags;
    INT Width;
    INT Precision;
    INT Prefix;
    INT Type;
    INT Length;
    INT TempInt;
    int wctombResult;
    int written = 0;
    int paddingReturnValue;
    va_list ap;
    
    va_copy(ap, aparg);

    while (*Fmt)
    {
        if (*Fmt == '%' &&
            TRUE == Silent_ExtractFormatA(&Fmt, TempBuff, &Flags, &Width, 
                                          &Precision, &Prefix, &Type))
        {
            if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_STRING)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                else if (WIDTH_INVALID == Width)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }
                else if (PRECISION_INVALID == Precision)
                {
                    /* both a '*' and a number, ignore, but remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWStr = va_arg(ap, LPWSTR);
                Length = Silent_WideCharToMultiByte(TempWStr, -1, 0, 0);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }
                TempStr = (LPSTR) PAL_malloc(Length);
                if (!TempStr)
                {
                    va_end(ap);
                    return -1;
                }
                if (PRECISION_DOT == Precision)
                {
                    /* copy nothing */
                    *TempStr = 0;
                    Length = 0;
                }
                else if (Precision > 0 && Precision < Length - 1)
                {
                    Length = Silent_WideCharToMultiByte(TempWStr, Precision, 
                                                        TempStr, Length);
                    if (!Length)
                    {
                        PAL_free(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    TempStr[Length] = 0;
                    Length = Precision;
                }
                /* copy everything */
                else
                {
                    wctombResult = Silent_WideCharToMultiByte(TempWStr, -1, 
                                                              TempStr, Length);
                    if (!wctombResult)
                    {
                        PAL_free(TempStr);
                        va_end(ap);
                        return -1;
                    }
                    --Length; /* exclude null char */
                }

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Silent_AddPaddingVfprintf(stream, TempStr, Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    PAL_free(TempStr);
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

                PAL_free(TempStr);
            }
            else if (Prefix == PFF_PREFIX_LONG && Type == PFF_TYPE_CHAR)
            {
                CHAR TempBuffer[4];
                if (WIDTH_STAR == Width ||
                    WIDTH_INVALID == Width)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }
                if (PRECISION_STAR == Precision ||
                    PRECISION_INVALID == Precision)
                {
                    /* ignore (because it's a char), and remove arg */
                    TempInt = va_arg(ap, INT); /* value not used */
                }

                TempWChar = va_arg(ap, int);
                Length = Silent_WideCharToMultiByte(&TempWChar, 1, TempBuffer, 4);
                if (!Length)
                {
                    va_end(ap);
                    return -1;
                }
                TempBuffer[Length] = 0;

                /* do the padding (if needed)*/
                paddingReturnValue =
                  Silent_AddPaddingVfprintf(stream, TempBuffer,
                                              Width - Length, Flags);
                if (-1 == paddingReturnValue)
                {
                    va_end(ap);
                    return -1;
                }
                written += paddingReturnValue;

            }
            /* this places the number of bytes written to the buffer in the
               next arg */
            else if (Type == PFF_TYPE_N)
            {
                if (WIDTH_STAR == Width)
                {
                    Width = va_arg(ap, INT);
                }
                if (PRECISION_STAR == Precision)
                {
                    Precision = va_arg(ap, INT);
                }

                if (Prefix == PFF_PREFIX_SHORT)
                {
                    *(va_arg(ap, short *)) = written;
                }
                else
                {
                    *(va_arg(ap, LPLONG)) = written;
                }
            }
            /* types that sprintf can handle */
            else
            {
                TempInt = 0;

                /* %h (short) doesn't seem to be handled properly by local sprintf,
                   so lets do the truncation ourselves.  (ptr -> int -> short to avoid
                   warnings */
                if (Type == PFF_TYPE_P && Prefix == PFF_PREFIX_SHORT)
                {
                    long trunc1;
                    short trunc2;

                    trunc1 = va_arg(ap, LONG);
                    trunc2 = (short)trunc1;

                    TempInt = fprintf((FILE*)stream, TempBuff, trunc2);
                }
                else if (Type == PFF_TYPE_INT && Prefix == PFF_PREFIX_SHORT)
                {
                    // Convert explicitly from int to short to get
                    // correct sign extension for shorts on all systems.
                    int n;
                    short s;

                    n = va_arg(ap, int);
                    s = (short)n;

                    TempInt = fprintf((FILE*)stream, TempBuff, s);
                }
                else
                {
                    va_list apcopy;
                    va_copy(apcopy, ap);
                    TempInt = PAL_vfprintf(stream, TempBuff, apcopy);
                    va_end(apcopy);
                    PAL_printf_arg_remover(&ap, Width, Precision, Type, Prefix);
                }

                if (-1 != TempInt)
                {
                    written += TempInt;
                }
            }
        }
        else
        {
#if FILE_OPS_CHECK_FERROR_OF_PREVIOUS_CALL
            clearerr((FILE*)stream);
#endif

            PAL_fwrite(Fmt++, 1, 1, stream); /* copy regular chars into buffer */
            if (stream->PALferrorCode == PAL_FILE_ERROR)
            {
                va_end(ap);
                return -1;
            }
            ++written;
        }
    }

    va_end(ap);
    return written;
}